

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O3

void * __thiscall nuraft::buffer_serializer::get_bytes(buffer_serializer *this,size_t *len)

{
  size_t sVar1;
  uint32_t uVar2;
  size_t sVar3;
  byte *pbVar4;
  overflow_error *this_00;
  
  uVar2 = get_u32(this);
  *len = (ulong)uVar2;
  sVar1 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (uVar2 + sVar1 <= sVar3) {
    sVar1 = *len;
    pbVar4 = buffer::data_begin(this->buf_);
    sVar3 = this->pos_;
    pos(this,sVar1 + sVar3);
    return pbVar4 + sVar3;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void* buffer_serializer::get_bytes(size_t& len) {
    len = get_u32();
    if ( !is_valid(len) ) throw std::overflow_error("not enough space");
    return get_raw(len);
}